

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

DescriptorFlags __thiscall
Js::DictionaryTypeHandlerBase<int>::GetSetterFromDescriptor<false>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,
          DictionaryPropertyDescriptor<int> *descriptor,Var *setterValue,PropertyValueInfo *info)

{
  int iVar1;
  Var pvVar2;
  DescriptorFlags DVar3;
  
  DVar3 = None;
  if ((descriptor->Attributes & 8) == 0) {
    iVar1 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(descriptor);
    if (iVar1 == -1) {
      iVar1 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(descriptor);
      DVar3 = None;
      if (iVar1 != -1) {
        iVar1 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(descriptor);
        pvVar2 = DynamicObject::GetSlot(instance,iVar1);
        *setterValue = pvVar2;
        DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(descriptor);
        DVar3 = Accessor;
        if (info != (PropertyValueInfo *)0x0) {
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = 0xffff;
          info->m_attributes = '\0';
          info->flags = InlineCacheNoFlags;
        }
      }
    }
    else if ((descriptor->Attributes & 4) == 0) {
      DVar3 = (uint)(descriptor->Attributes >> 7) * 8 + Data;
    }
    else {
      DVar3 = WritableData;
    }
  }
  return DVar3;
}

Assistant:

DescriptorFlags DictionaryTypeHandlerBase<T>::GetSetterFromDescriptor(DynamicObject* instance, DictionaryPropertyDescriptor<T> * descriptor, Var* setterValue, PropertyValueInfo* info)
    {
        if (descriptor->Attributes & PropertyDeleted)
        {
            return None;
        }
        if (descriptor->template GetDataPropertyIndex<allowLetConstGlobal>() != NoSlots)
        {
            // not a setter but shadows
            if (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
            {
                return (descriptor->Attributes & PropertyConst) ? (DescriptorFlags)(Const | Data) : WritableData;
            }
            if (descriptor->Attributes & PropertyWritable)
            {
                return WritableData;
            }
            if (descriptor->Attributes & PropertyConst)
            {
                return (DescriptorFlags)(Const | Data);
            }
            return Data;
        }
        else if (descriptor->GetSetterPropertyIndex() != NoSlots)
        {
            *setterValue = ((DynamicObject*)instance)->GetSlot(descriptor->GetSetterPropertyIndex());
            SetPropertyValueInfoNonFixed(info, instance, descriptor->GetSetterPropertyIndex(), descriptor->Attributes, InlineCacheSetterFlag);
            return Accessor;
        }
        return None;
    }